

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reddit.h
# Opt level: O1

vector<Comment,_std::allocator<Comment>_> * __thiscall
Reddit::requestNewComments
          (vector<Comment,_std::allocator<Comment>_> *__return_storage_ptr__,Reddit *this)

{
  pointer pCVar1;
  pointer pcVar2;
  __normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_> _Var3;
  long lVar4;
  pointer pCVar5;
  vector<Comment,_std::allocator<Comment>_> allComments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<Comment,_std::allocator<Comment>_> local_48;
  
  requestComments(&local_48,this);
  _Var3 = std::
          __partition<__gnu_cxx::__normal_iterator<Comment*,std::vector<Comment,std::allocator<Comment>>>,Reddit::requestNewComments()::_lambda(Comment_const&)_1_>
                    (local_48.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_48.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
                     super__Vector_impl_data._M_finish,this);
  (__return_storage_ptr__->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (long)_Var3._M_current -
          (long)local_48.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
                super__Vector_impl_data._M_start) {
    lVar4 = (ulong)((long)_Var3._M_current -
                   (long)local_48.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0xf0 + 1;
    pCVar5 = local_48.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      std::vector<Comment,_std::allocator<Comment>_>::emplace_back<Comment>
                (__return_storage_ptr__,pCVar5);
      pCVar5 = pCVar5 + 1;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  pCVar5 = (__return_storage_ptr__->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (__return_storage_ptr__->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar5 != pCVar1) {
    do {
      pcVar2 = (pCVar5->id)._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + (pCVar5->id)._M_string_length);
      Cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::add
                (&this->commentCache,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      pCVar5 = pCVar5 + 1;
    } while (pCVar5 != pCVar1);
  }
  std::vector<Comment,_std::allocator<Comment>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Comment> requestNewComments() {
			std::vector<Comment> allComments = requestComments();

			const auto pos = std::partition(allComments.begin(), allComments.end(), [&](const Comment& c) {
				return (c.author != "std_bot") and !commentCache.isKnown(c.id);
			});

			std::vector<Comment> filteredComments;
			std::move(allComments.begin(), pos, std::back_inserter(filteredComments));

			for (const Comment& comment : filteredComments) {
				commentCache.add(comment.id);
			}

			return filteredComments;
		}